

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineRasterizationLineStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineRasterizationLineStateCreateInfo>
          (Impl *this,VkPipelineRasterizationLineStateCreateInfo *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineRasterizationLineStateCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineRasterizationLineStateCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineRasterizationLineStateCreateInfo *)0x0) {
      pVVar1 = (VkPipelineRasterizationLineStateCreateInfo *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkPipelineRasterizationLineStateCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}